

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

bool testing::TestSuite::TestPassed(TestInfo *test_info)

{
  bool bVar1;
  TestInfo *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  bVar1 = TestInfo::should_run(in_RDI);
  uVar2 = false;
  if (bVar1) {
    TestInfo::result(in_RDI);
    uVar2 = TestResult::Passed((TestResult *)CONCAT17(uVar2,in_stack_fffffffffffffff0));
  }
  return (bool)uVar2;
}

Assistant:

static bool TestPassed(const TestInfo* test_info) {
    return test_info->should_run() && test_info->result()->Passed();
  }